

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.c
# Opt level: O1

int fits_img_stats_short
              (short *array,long nx,long ny,int nullcheck,short nullvalue,long *ngoodpix,
              short *minvalue,short *maxvalue,double *mean,double *sigma,double *noise1,
              double *noise2,double *noise3,double *noise5,int *status)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  short sVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  long ii;
  ulong uVar9;
  void *__ptr;
  double *pdVar10;
  ulong uVar11;
  double *arr;
  double *arr_00;
  double *__ptr_00;
  double *__base;
  double *__base_00;
  size_t sVar12;
  size_t sVar13;
  long lVar14;
  ushort uVar15;
  long lVar16;
  short *psVar17;
  short sVar18;
  uint uVar19;
  ulong uVar20;
  int iVar21;
  short *psVar22;
  long lVar23;
  size_t sVar24;
  uint uVar25;
  uint uVar26;
  short sVar27;
  uint uVar28;
  size_t __nmemb;
  short sVar29;
  uint uVar30;
  int iVar31;
  size_t __nmemb_00;
  int iVar32;
  ulong uVar33;
  uint uVar34;
  bool bVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  size_t local_d0;
  uint local_a8;
  uint local_a4;
  uint local_a0;
  uint local_9c;
  size_t local_80;
  long local_68;
  size_t local_60;
  uint local_54;
  long local_50;
  
  uVar20 = nx;
  if (mean != (double *)0x0 || sigma != (double *)0x0) {
    uVar9 = ny * nx;
    if (nullcheck == 0) {
      if ((long)uVar9 < 1) goto LAB_001f8ba4;
      dVar36 = 0.0;
      lVar23 = 0;
      dVar38 = 0.0;
      do {
        dVar37 = (double)(int)array[lVar23];
        dVar38 = dVar38 + dVar37;
        dVar36 = dVar36 + dVar37 * dVar37;
        lVar23 = lVar23 + 1;
        uVar20 = uVar9;
      } while (uVar9 - lVar23 != 0);
    }
    else if ((long)uVar9 < 1) {
      uVar9 = 0;
LAB_001f8ba4:
      dVar38 = 0.0;
      dVar36 = 0.0;
      uVar20 = uVar9;
    }
    else {
      dVar36 = 0.0;
      uVar20 = 0;
      dVar38 = 0.0;
      lVar23 = 0;
      do {
        if (array[lVar23] != nullvalue) {
          dVar37 = (double)(int)array[lVar23];
          uVar20 = uVar20 + 1;
          dVar38 = dVar38 + dVar37;
          dVar36 = dVar36 + dVar37 * dVar37;
        }
        lVar23 = lVar23 + 1;
      } while (uVar9 - lVar23 != 0);
    }
    if ((long)uVar20 < 2) {
      dVar36 = 0.0;
      bVar35 = uVar20 == 1;
      uVar20 = (ulong)bVar35;
      if (!bVar35) {
        dVar38 = 0.0;
      }
    }
    else {
      dVar38 = dVar38 / (double)(long)uVar20;
      dVar36 = dVar36 / (double)(long)uVar20 - dVar38 * dVar38;
      if (dVar36 < 0.0) {
        dVar36 = sqrt(dVar36);
      }
      else {
        dVar36 = SQRT(dVar36);
      }
    }
    if (ngoodpix != (long *)0x0) {
      *ngoodpix = uVar20;
    }
    if (mean != (double *)0x0) {
      *mean = dVar38;
    }
    if (sigma != (double *)0x0) {
      *sigma = dVar36;
    }
  }
  if (noise1 != (double *)0x0) {
    dVar36 = 0.0;
    if (2 < nx) {
      __ptr = calloc(nx,2);
      if (__ptr != (void *)0x0) {
        pdVar10 = (double *)calloc(ny,8);
        if (pdVar10 != (double *)0x0) {
          if (ny < 1) {
            local_d0 = 0;
          }
          else {
            local_d0 = 0;
            lVar23 = 0;
            psVar22 = array;
            do {
              lVar16 = 0;
              lVar14 = lVar16;
              if (nullcheck != 0) {
                do {
                  lVar14 = lVar16;
                  if (psVar22[lVar16] != nullvalue) break;
                  lVar16 = lVar16 + 1;
                  lVar14 = nx;
                } while (nx != lVar16);
              }
              if (lVar14 != nx) {
                lVar16 = lVar14 + 1;
                if (lVar16 < nx) {
                  psVar17 = array + lVar23 * nx + lVar14;
                  uVar9 = 0;
                  do {
                    lVar14 = lVar16;
                    if ((nullcheck != 0) && (lVar16 < nx)) {
                      do {
                        lVar14 = lVar16;
                        if (psVar22[lVar16] != nullvalue) break;
                        lVar16 = lVar16 + 1;
                        lVar14 = nx;
                      } while (nx != lVar16);
                    }
                    if (lVar14 == nx) break;
                    sVar29 = *psVar17;
                    psVar17 = array + lVar23 * nx + lVar14;
                    *(short *)((long)__ptr + uVar9 * 2) = sVar29 - *psVar17;
                    uVar9 = uVar9 + 1;
                    lVar16 = lVar14 + 1;
                  } while (lVar16 < nx);
                }
                else {
                  uVar9 = 0;
                }
                if (1 < uVar9) {
                  dVar36 = 0.0;
                  dVar38 = 0.0;
                  uVar11 = 0;
                  do {
                    dVar37 = (double)(int)*(short *)((long)__ptr + uVar11 * 2);
                    dVar38 = dVar38 + dVar37;
                    dVar36 = dVar36 + dVar37 * dVar37;
                    uVar11 = uVar11 + 1;
                  } while (uVar9 != uVar11);
                  dVar38 = dVar38 / (double)(long)uVar9;
                  dVar36 = dVar36 / (double)(long)uVar9 - dVar38 * dVar38;
                  if (dVar36 < 0.0) {
                    dVar36 = sqrt(dVar36);
                  }
                  else {
                    dVar36 = SQRT(dVar36);
                  }
                  if (0.0 < dVar36) {
                    iVar31 = 0;
                    do {
                      if ((long)uVar9 < 1) {
                        uVar33 = 0;
                      }
                      else {
                        uVar11 = 0;
                        uVar33 = 0;
                        do {
                          sVar29 = *(short *)((long)__ptr + uVar11 * 2);
                          if (ABS((double)(int)sVar29 - dVar38) < dVar36 * 5.0) {
                            if ((long)uVar33 < (long)uVar11) {
                              *(short *)((long)__ptr + uVar33 * 2) = sVar29;
                            }
                            uVar33 = uVar33 + 1;
                          }
                          uVar11 = uVar11 + 1;
                        } while (uVar9 != uVar11);
                      }
                      if (uVar33 == uVar9) break;
                      if ((long)uVar33 < 1) {
                        dVar38 = 0.0;
                        dVar36 = 0.0;
                      }
                      else {
                        dVar36 = 0.0;
                        dVar38 = 0.0;
                        uVar9 = 0;
                        do {
                          dVar37 = (double)(int)*(short *)((long)__ptr + uVar9 * 2);
                          dVar38 = dVar38 + dVar37;
                          dVar36 = dVar36 + dVar37 * dVar37;
                          uVar9 = uVar9 + 1;
                        } while (uVar33 != uVar9);
                      }
                      if ((long)uVar33 < 2) {
                        dVar36 = 0.0;
                        if (uVar33 != 1) {
                          dVar38 = 0.0;
                        }
                      }
                      else {
                        dVar38 = dVar38 / (double)(long)uVar33;
                        dVar36 = dVar36 / (double)(long)uVar33 - dVar38 * dVar38;
                        if (dVar36 < 0.0) {
                          dVar36 = sqrt(dVar36);
                        }
                        else {
                          dVar36 = SQRT(dVar36);
                        }
                      }
                      iVar31 = iVar31 + 1;
                      uVar9 = uVar33;
                    } while (iVar31 != 3);
                  }
                  pdVar10[local_d0] = dVar36;
                  local_d0 = local_d0 + 1;
                }
              }
              lVar23 = lVar23 + 1;
              psVar22 = psVar22 + nx;
            } while (lVar23 != ny);
          }
          if (local_d0 == 0) {
            dVar36 = 0.0;
          }
          else if (local_d0 == 1) {
            dVar36 = *pdVar10;
          }
          else {
            qsort(pdVar10,local_d0,8,FnCompare_double);
            dVar36 = (*(double *)
                       ((long)pdVar10 +
                       ((local_d0 - ((long)(local_d0 - 1) >> 0x3f)) - 1 & 0xfffffffffffffffe) * 4) +
                     *(double *)
                      ((long)pdVar10 +
                      (local_d0 - ((long)local_d0 >> 0x3f) & 0xfffffffffffffffe) * 4)) * 0.5;
          }
          dVar36 = dVar36 * 0.70710678;
          free(pdVar10);
          free(__ptr);
          goto LAB_001f9062;
        }
        free(__ptr);
      }
      *status = 0x71;
      dVar36 = 0.0;
    }
LAB_001f9062:
    *noise1 = dVar36;
  }
  if ((minvalue == (short *)0x0 && maxvalue == (short *)0x0) && noise3 == (double *)0x0)
  goto LAB_001f98c5;
  lVar23 = 1;
  __nmemb = ny;
  if (nx < 9) {
    __nmemb = 1;
    lVar23 = ny;
  }
  __nmemb_00 = lVar23 * nx;
  if ((long)__nmemb_00 < 9) {
    dVar37 = 0.0;
    if ((long)__nmemb_00 < 1) {
      sVar29 = -0x8000;
      sVar18 = 0x7fff;
      uVar20 = 0;
    }
    else {
      sVar18 = 0x7fff;
      lVar23 = 0;
      uVar20 = 0;
      sVar27 = -0x8000;
      do {
        if ((nullcheck == 0) || (sVar29 = sVar27, array[lVar23] != nullvalue)) {
          sVar29 = array[lVar23];
          if (sVar29 < sVar18) {
            sVar18 = sVar29;
          }
          if (sVar29 <= sVar27) {
            sVar29 = sVar27;
          }
          uVar20 = uVar20 + 1;
        }
        lVar23 = lVar23 + 1;
        sVar27 = sVar29;
      } while (__nmemb_00 - lVar23 != 0);
    }
    dVar36 = 0.0;
    dVar38 = 0.0;
  }
  else {
    pdVar10 = (double *)calloc(__nmemb_00,4);
    if (pdVar10 != (double *)0x0) {
      arr = (double *)calloc(__nmemb_00,4);
      if (arr != (double *)0x0) {
        arr_00 = (double *)calloc(__nmemb_00,4);
        if (arr_00 == (double *)0x0) {
          free(pdVar10);
          pdVar10 = arr;
        }
        else {
          __ptr_00 = (double *)calloc(__nmemb,8);
          if (__ptr_00 == (double *)0x0) {
            free(pdVar10);
            free(arr);
            pdVar10 = arr_00;
          }
          else {
            __base = (double *)calloc(__nmemb,8);
            if (__base == (double *)0x0) {
              free(pdVar10);
              free(arr);
              free(arr_00);
              pdVar10 = __ptr_00;
            }
            else {
              __base_00 = (double *)calloc(__nmemb,8);
              if (__base_00 != (double *)0x0) {
                if ((long)__nmemb < 1) {
                  sVar29 = -0x8000;
                  sVar18 = 0x7fff;
                  uVar20 = 0;
                  local_80 = 0;
                  local_60 = 0;
                }
                else {
                  uVar19 = 0x7fff;
                  sVar24 = 0;
                  local_60 = 0;
                  local_80 = 0;
                  uVar20 = 0;
                  psVar22 = array;
                  uVar28 = 0x8000;
                  do {
                    sVar12 = 0;
                    sVar13 = sVar12;
                    if (nullcheck != 0) {
                      do {
                        sVar13 = sVar12;
                        if (psVar22[sVar12] != nullvalue) break;
                        sVar12 = sVar12 + 1;
                        sVar13 = __nmemb_00;
                      } while (__nmemb_00 - sVar12 != 0);
                    }
                    uVar30 = uVar28;
                    if (sVar13 != __nmemb_00) {
                      lVar14 = sVar24 * __nmemb_00;
                      uVar15 = array[lVar14 + sVar13];
                      if ((short)uVar15 < (short)uVar19) {
                        uVar19 = (uint)uVar15;
                      }
                      uVar30 = (uint)uVar15;
                      if ((short)uVar15 <= (short)uVar28) {
                        uVar30 = uVar28;
                      }
                      sVar13 = sVar13 + 1;
                      sVar12 = sVar13;
                      if ((nullcheck != 0) && ((long)sVar13 < (long)__nmemb_00)) {
                        do {
                          sVar12 = sVar13;
                          if (psVar22[sVar13] != nullvalue) break;
                          sVar13 = sVar13 + 1;
                          sVar12 = __nmemb_00;
                        } while (__nmemb_00 - sVar13 != 0);
                      }
                      if (sVar12 == __nmemb_00) {
                        uVar20 = uVar20 + 1;
                      }
                      else {
                        uVar1 = array[lVar14 + sVar12];
                        if ((short)uVar1 < (short)uVar19) {
                          uVar19 = (uint)uVar1;
                        }
                        uVar28 = (uint)uVar1;
                        if ((short)uVar1 <= (short)uVar30) {
                          uVar28 = uVar30;
                        }
                        uVar30 = uVar28;
                        sVar12 = sVar12 + 1;
                        sVar13 = sVar12;
                        if ((nullcheck != 0) && ((long)sVar12 < (long)__nmemb_00)) {
                          do {
                            sVar13 = sVar12;
                            if (psVar22[sVar12] != nullvalue) break;
                            sVar12 = sVar12 + 1;
                            sVar13 = __nmemb_00;
                          } while (__nmemb_00 - sVar12 != 0);
                        }
                        if (sVar13 == __nmemb_00) {
                          uVar20 = uVar20 + 2;
                        }
                        else {
                          uVar2 = array[lVar14 + sVar13];
                          if ((short)uVar2 < (short)uVar19) {
                            uVar19 = (uint)uVar2;
                          }
                          uVar28 = (uint)uVar2;
                          if ((short)uVar2 <= (short)uVar30) {
                            uVar28 = uVar30;
                          }
                          uVar30 = uVar28;
                          sVar13 = sVar13 + 1;
                          sVar12 = sVar13;
                          if ((nullcheck != 0) && ((long)sVar13 < (long)__nmemb_00)) {
                            do {
                              sVar12 = sVar13;
                              if (psVar22[sVar13] != nullvalue) break;
                              sVar13 = sVar13 + 1;
                              sVar12 = __nmemb_00;
                            } while (__nmemb_00 - sVar13 != 0);
                          }
                          if (sVar12 == __nmemb_00) {
                            uVar20 = uVar20 + 3;
                          }
                          else {
                            uVar3 = array[lVar14 + sVar12];
                            local_a8 = (uint)uVar3;
                            if ((short)uVar3 < (short)uVar19) {
                              uVar19 = (uint)uVar3;
                            }
                            uVar28 = local_a8;
                            if ((short)uVar3 <= (short)uVar30) {
                              uVar28 = uVar30;
                            }
                            uVar30 = uVar28;
                            sVar12 = sVar12 + 1;
                            sVar13 = sVar12;
                            if ((nullcheck != 0) && ((long)sVar12 < (long)__nmemb_00)) {
                              do {
                                sVar13 = sVar12;
                                if (psVar22[sVar12] != nullvalue) break;
                                sVar12 = sVar12 + 1;
                                sVar13 = __nmemb_00;
                              } while (__nmemb_00 - sVar12 != 0);
                            }
                            if (sVar13 == __nmemb_00) {
                              uVar20 = uVar20 + 4;
                            }
                            else {
                              uVar3 = array[lVar14 + sVar13];
                              local_9c = (uint)uVar3;
                              if ((short)uVar3 < (short)uVar19) {
                                uVar19 = (uint)uVar3;
                              }
                              uVar28 = local_9c;
                              if ((short)uVar3 <= (short)uVar30) {
                                uVar28 = uVar30;
                              }
                              uVar30 = uVar28;
                              sVar13 = sVar13 + 1;
                              sVar12 = sVar13;
                              if ((nullcheck != 0) && ((long)sVar13 < (long)__nmemb_00)) {
                                do {
                                  sVar12 = sVar13;
                                  if (psVar22[sVar13] != nullvalue) break;
                                  sVar13 = sVar13 + 1;
                                  sVar12 = __nmemb_00;
                                } while (__nmemb_00 - sVar13 != 0);
                              }
                              if (sVar12 == __nmemb_00) {
                                uVar20 = uVar20 + 5;
                              }
                              else {
                                uVar3 = array[lVar14 + sVar12];
                                local_a0 = (uint)uVar3;
                                if ((short)uVar3 < (short)uVar19) {
                                  uVar19 = (uint)uVar3;
                                }
                                uVar28 = local_a0;
                                if ((short)uVar3 <= (short)uVar30) {
                                  uVar28 = uVar30;
                                }
                                uVar30 = uVar28;
                                sVar12 = sVar12 + 1;
                                sVar13 = sVar12;
                                if ((nullcheck != 0) && ((long)sVar12 < (long)__nmemb_00)) {
                                  do {
                                    sVar13 = sVar12;
                                    if (psVar22[sVar12] != nullvalue) break;
                                    sVar12 = sVar12 + 1;
                                    sVar13 = __nmemb_00;
                                  } while (__nmemb_00 - sVar12 != 0);
                                }
                                if (sVar13 == __nmemb_00) {
                                  uVar20 = uVar20 + 6;
                                }
                                else {
                                  uVar3 = array[lVar14 + sVar13];
                                  if ((short)uVar3 < (short)uVar19) {
                                    uVar19 = (uint)uVar3;
                                  }
                                  uVar28 = (uint)uVar3;
                                  if ((short)uVar3 <= (short)uVar30) {
                                    uVar28 = uVar30;
                                  }
                                  uVar30 = uVar28;
                                  sVar13 = sVar13 + 1;
                                  sVar12 = sVar13;
                                  if ((nullcheck != 0) && ((long)sVar13 < (long)__nmemb_00)) {
                                    do {
                                      sVar12 = sVar13;
                                      if (psVar22[sVar13] != nullvalue) break;
                                      sVar13 = sVar13 + 1;
                                      sVar12 = __nmemb_00;
                                    } while (__nmemb_00 - sVar13 != 0);
                                  }
                                  if (sVar12 == __nmemb_00) {
                                    uVar20 = uVar20 + 7;
                                  }
                                  else {
                                    uVar4 = array[lVar14 + sVar12];
                                    lVar16 = uVar20 + 8;
                                    if ((short)uVar4 < (short)uVar19) {
                                      uVar19 = (uint)uVar4;
                                    }
                                    uVar28 = (uint)uVar4;
                                    if ((short)uVar4 <= (short)uVar30) {
                                      uVar28 = uVar30;
                                    }
                                    sVar12 = sVar12 + 1;
                                    uVar30 = uVar28;
                                    if ((long)sVar12 < (long)__nmemb_00) {
                                      local_50 = 0;
                                      local_68 = 0;
                                      uVar28 = (uint)uVar2;
                                      local_54 = (uint)uVar3;
                                      uVar25 = (uint)uVar4;
                                      uVar34 = (uint)uVar1;
                                      do {
                                        local_a4 = uVar28;
                                        uVar7 = local_9c;
                                        uVar6 = local_a0;
                                        uVar28 = local_a8;
                                        local_9c = local_a0;
                                        local_a0 = local_54;
                                        sVar13 = sVar12;
                                        if ((nullcheck != 0) && ((long)sVar12 < (long)__nmemb_00)) {
                                          do {
                                            sVar13 = sVar12;
                                            if (psVar22[sVar12] != nullvalue) break;
                                            sVar12 = sVar12 + 1;
                                            sVar13 = __nmemb_00;
                                          } while (__nmemb_00 - sVar12 != 0);
                                        }
                                        if (sVar13 == __nmemb_00) break;
                                        sVar29 = array[lVar14 + sVar13];
                                        uVar26 = (uint)sVar29;
                                        if (sVar29 < (short)uVar19) {
                                          uVar19 = uVar26;
                                        }
                                        if ((short)uVar30 < sVar29) {
                                          uVar30 = uVar26;
                                        }
                                        sVar27 = (short)uVar7;
                                        iVar31 = (int)sVar27;
                                        local_a8 = uVar7;
                                        sVar18 = (short)uVar6;
                                        sVar29 = (short)local_54;
                                        if (sVar29 != sVar18 || sVar27 != sVar18) {
                                          iVar32 = iVar31 - sVar29;
                                          iVar8 = -iVar32;
                                          if (0 < iVar32) {
                                            iVar8 = iVar32;
                                          }
                                          *(int *)((long)pdVar10 + local_68 * 4) = iVar8;
                                          local_68 = local_68 + 1;
                                        }
                                        sVar5 = (short)uVar28;
                                        if (((sVar5 == sVar27 && (short)local_a4 == sVar5) &&
                                            sVar27 == sVar18) && sVar29 == sVar18) {
                                          lVar16 = lVar16 + 1;
                                        }
                                        else {
                                          iVar32 = (int)(short)local_a4 + (int)sVar29;
                                          iVar21 = iVar31 * 2 - iVar32;
                                          iVar8 = -iVar21;
                                          if (0 < iVar21) {
                                            iVar8 = iVar21;
                                          }
                                          *(int *)((long)arr + local_50 * 4) = iVar8;
                                          iVar8 = (int)(short)uVar15 + iVar31 * 6 + iVar32 * -4 +
                                                  uVar26;
                                          iVar31 = -iVar8;
                                          if (0 < iVar8) {
                                            iVar31 = iVar8;
                                          }
                                          *(int *)((long)arr_00 + local_50 * 4) = iVar31;
                                          local_50 = local_50 + 1;
                                        }
                                        sVar12 = sVar13 + 1;
                                        uVar15 = (ushort)uVar34;
                                        local_54 = uVar25;
                                        uVar25 = uVar26;
                                        uVar34 = local_a4;
                                      } while ((long)sVar12 < (long)__nmemb_00);
                                    }
                                    else {
                                      local_68 = 0;
                                      local_50 = 0;
                                    }
                                    uVar20 = lVar16 + local_50;
                                    if (local_50 != 0) {
                                      if (local_50 == 1) {
                                        if (local_68 == 1) {
                                          __ptr_00[local_80] = (double)*(int *)pdVar10;
                                          local_80 = local_80 + 1;
                                        }
                                        __base[local_60] = (double)*(int *)arr;
                                        iVar31 = *(int *)arr_00;
                                      }
                                      else {
                                        iVar31 = (int)local_50;
                                        if (1 < local_68) {
                                          iVar8 = quick_select_int((int *)pdVar10,iVar31);
                                          __ptr_00[local_80] = (double)iVar8;
                                          local_80 = local_80 + 1;
                                        }
                                        iVar8 = quick_select_int((int *)arr,iVar31);
                                        __base[local_60] = (double)iVar8;
                                        iVar31 = quick_select_int((int *)arr_00,iVar31);
                                      }
                                      __base_00[local_60] = (double)iVar31;
                                      local_60 = local_60 + 1;
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                    sVar29 = (short)uVar30;
                    sVar18 = (short)uVar19;
                    sVar24 = sVar24 + 1;
                    psVar22 = psVar22 + lVar23 * nx;
                    uVar28 = uVar30;
                  } while (sVar24 != __nmemb);
                }
                dVar36 = 0.0;
                dVar38 = 0.0;
                if (local_60 != 0) {
                  if (local_60 == 1) {
                    dVar36 = *__base;
                    dVar38 = *__base_00;
                  }
                  else {
                    qsort(__base,local_60,8,FnCompare_double);
                    qsort(__base_00,local_60,8,FnCompare_double);
                    lVar23 = ((local_60 - ((long)(local_60 - 1) >> 0x3f)) - 1 & 0x3ffffffffffffffe)
                             * 4;
                    lVar14 = (local_60 - ((long)local_60 >> 0x3f) & 0x3ffffffffffffffe) * 4;
                    dVar36 = (*(double *)((long)__base + lVar23) +
                             *(double *)((long)__base + lVar14)) * 0.5;
                    dVar38 = (*(double *)((long)__base_00 + lVar23) +
                             *(double *)((long)__base_00 + lVar14)) * 0.5;
                  }
                }
                dVar37 = 0.0;
                if (local_80 != 0) {
                  if (local_80 == 1) {
                    dVar37 = *__ptr_00;
                  }
                  else {
                    qsort(__ptr_00,local_80,8,FnCompare_double);
                    dVar37 = (*(double *)
                               ((long)__ptr_00 +
                               ((local_80 - ((long)(local_80 - 1) >> 0x3f)) - 1 & 0xfffffffffffffffe
                               ) * 4) +
                             *(double *)
                              ((long)__ptr_00 +
                              (local_80 - ((long)local_80 >> 0x3f) & 0xfffffffffffffffe) * 4)) * 0.5
                    ;
                  }
                }
                dVar37 = dVar37 * 1.0483579;
                dVar36 = dVar36 * 0.6052697;
                dVar38 = dVar38 * 0.1772048;
                free(__base_00);
                free(__base);
                free(__ptr_00);
                free(arr_00);
                free(arr);
                free(pdVar10);
                goto LAB_001f9880;
              }
              free(pdVar10);
              free(arr);
              free(arr_00);
              free(__ptr_00);
              pdVar10 = __base;
            }
          }
        }
      }
      free(pdVar10);
    }
    *status = 0x71;
    dVar37 = 0.0;
    sVar18 = 0;
    sVar29 = 0;
    dVar36 = 0.0;
    dVar38 = 0.0;
  }
LAB_001f9880:
  if (ngoodpix != (long *)0x0) {
    *ngoodpix = uVar20;
  }
  if (minvalue != (short *)0x0) {
    *minvalue = sVar18;
  }
  if (maxvalue != (short *)0x0) {
    *maxvalue = sVar29;
  }
  if (noise2 != (double *)0x0) {
    *noise2 = dVar37;
  }
  if (noise3 != (double *)0x0) {
    *noise3 = dVar36;
  }
  if (noise5 != (double *)0x0) {
    *noise5 = dVar38;
  }
LAB_001f98c5:
  return *status;
}

Assistant:

int fits_img_stats_short(short *array, /*  2 dimensional array of image pixels */
        long nx,            /* number of pixels in each row of the image */
	long ny,            /* number of rows in the image */
	                    /* (if this is a 3D image, then ny should be the */
			    /* product of the no. of rows times the no. of planes) */
	int nullcheck,      /* check for null values, if true */
	short nullvalue,    /* value of null pixels, if nullcheck is true */

   /* returned parameters (if the pointer is not null)  */
	long *ngoodpix,     /* number of non-null pixels in the image */
	short *minvalue,    /* returned minimum non-null value in the array */
	short *maxvalue,    /* returned maximum non-null value in the array */
	double *mean,       /* returned mean value of all non-null pixels */
	double *sigma,      /* returned R.M.S. value of all non-null pixels */
	double *noise1,     /* 1st order estimate of noise in image background level */
	double *noise2,     /* 2nd order estimate of noise in image background level */
	double *noise3,     /* 3rd order estimate of noise in image background level */
	double *noise5,     /* 5th order estimate of noise in image background level */
	int *status)        /* error status */

/*
    Compute statistics of the input short integer image.
*/
{
	long ngood;
	short minval = 0, maxval = 0;
	double xmean = 0., xsigma = 0., xnoise = 0., xnoise2 = 0., xnoise3 = 0., xnoise5 = 0.;

	/* need to calculate mean and/or sigma and/or limits? */
	if (mean || sigma ) {
		FnMeanSigma_short(array, nx * ny, nullcheck, nullvalue, 
			&ngood, &xmean, &xsigma, status);

	    if (ngoodpix) *ngoodpix = ngood;
	    if (mean)     *mean = xmean;
	    if (sigma)    *sigma = xsigma;
	}

	if (noise1) {
		FnNoise1_short(array, nx, ny, nullcheck, nullvalue, 
		  &xnoise, status);

		*noise1  = xnoise;
	}

	if (minvalue || maxvalue || noise3) {
		FnNoise5_short(array, nx, ny, nullcheck, nullvalue, 
			&ngood, &minval, &maxval, &xnoise2, &xnoise3, &xnoise5, status);

		if (ngoodpix) *ngoodpix = ngood;
		if (minvalue) *minvalue= minval;
		if (maxvalue) *maxvalue = maxval;
		if (noise2) *noise2  = xnoise2;
		if (noise3) *noise3  = xnoise3;
		if (noise5) *noise5  = xnoise5;
	}
	return(*status);
}